

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_armor.cpp
# Opt level: O1

void __thiscall ABasicArmorBonus::Serialize(ABasicArmorBonus *this,FSerializer *arc)

{
  BYTE *pBVar1;
  int iVar2;
  undefined4 extraout_var;
  FSerializer *pFVar3;
  double *pdVar4;
  double *pdVar5;
  
  AInventory::Serialize((AInventory *)this,arc);
  if ((this->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject.Class ==
      (PClass *)0x0) {
    iVar2 = (**(this->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject.
               _vptr_DObject)(this);
    (this->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject.Class =
         (PClass *)CONCAT44(extraout_var,iVar2);
  }
  pBVar1 = ((this->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject.Class)->
           Defaults;
  pdVar5 = (double *)0x0;
  pdVar4 = (double *)(pBVar1 + 0x500);
  if (save_full != false) {
    pdVar4 = pdVar5;
  }
  pFVar3 = ::Serialize(arc,"savepercent",&this->SavePercent,pdVar4);
  pdVar4 = (double *)(pBVar1 + 0x514);
  if (save_full != false) {
    pdVar4 = pdVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"saveamount",&this->SaveAmount,(int32_t *)pdVar4);
  pdVar4 = (double *)(pBVar1 + 0x508);
  if (save_full != false) {
    pdVar4 = pdVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"maxsaveamount",&this->MaxSaveAmount,(int32_t *)pdVar4);
  pdVar4 = (double *)(pBVar1 + 0x518);
  if (save_full != false) {
    pdVar4 = pdVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"bonuscount",&this->BonusCount,(int32_t *)pdVar4);
  pdVar4 = (double *)(pBVar1 + 0x51c);
  if (save_full != false) {
    pdVar4 = pdVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"bonusmax",&this->BonusMax,(int32_t *)pdVar4);
  pdVar4 = (double *)(pBVar1 + 0x50c);
  if (save_full != false) {
    pdVar4 = pdVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"maxabsorb",&this->MaxAbsorb,(int32_t *)pdVar4);
  pdVar4 = (double *)(pBVar1 + 0x510);
  if (save_full != false) {
    pdVar4 = pdVar5;
  }
  ::Serialize(pFVar3,"maxfullabsorb",&this->MaxFullAbsorb,(int32_t *)pdVar4);
  return;
}

Assistant:

void ABasicArmorBonus::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	auto def = (ABasicArmorBonus *)GetDefault();
	arc("savepercent", SavePercent, def->SavePercent)
		("saveamount", SaveAmount, def->SaveAmount)
		("maxsaveamount", MaxSaveAmount, def->MaxSaveAmount)
		("bonuscount", BonusCount, def->BonusCount)
		("bonusmax", BonusMax, def->BonusMax)
		("maxabsorb", MaxAbsorb, def->MaxAbsorb)
		("maxfullabsorb", MaxFullAbsorb, def->MaxFullAbsorb);
}